

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_draw.c
# Opt level: O0

void draw_bmap(bmap_t *bm,int x,int y,guint8 *im,size_t w,size_t h)

{
  int iVar1;
  int iVar2;
  int p;
  int xx;
  int i;
  int yy;
  int j;
  size_t h_local;
  size_t w_local;
  guint8 *im_local;
  int y_local;
  int x_local;
  bmap_t *bm_local;
  
  j = 0;
  do {
    if (bm->h <= j) {
      return;
    }
    iVar1 = y + j;
    if (-1 < iVar1) {
      if ((int)h + -1 < iVar1) {
        return;
      }
      for (i = 0; i < bm->w; i = i + 1) {
        iVar2 = x + i;
        if (-1 < iVar2) {
          if ((int)w + -1 < iVar2) break;
          p = (uint)im[(long)iVar1 * w + (long)iVar2] + (uint)bm->b[bm->w * j + i];
          if (0xff < (uint)p) {
            p = 0xff;
          }
          im[(long)iVar1 * w + (long)iVar2] = (guint8)p;
        }
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

static inline void draw_bmap(bmap_t *bm, int x, int y, guint8 *im, size_t w, size_t h) {
    for (int j = 0; j < bm->h; ++j) {
        int yy = y + j;
        _CHK(yy, h);
        for (int i = 0; i < bm->w; ++i) {
            int xx = x + i;
            _CHK(xx, w);

            int p = bm->b[bm->w * j + i];
            p += im[yy * w + xx];
            if (p > 255)
                p = 255;
            im[yy * w + xx] = p;
        }
    }
}